

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O0

char * mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::GetTypeName(void)

{
  int iVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_20 [32];
  
  if (ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::GetTypeName()::
      name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::
                                 GetTypeName()::name_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                 (allocator<char> *)in_stack_ffffffffffffffb0);
      AlgebraicExpression<mp::LinTerms>::GetTypeName_abi_cxx11_();
      std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::operator+(in_stack_ffffffffffffff88,(char)((ulong)&stack0xffffffffffffffbf >> 0x38));
      std::__cxx11::string::~string(local_20);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
      __cxa_atexit(std::__cxx11::string::~string,
                   &ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::GetTypeName()
                    ::name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::
                           GetTypeName()::name_abi_cxx11_);
    }
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

static const char* GetTypeName() {
    static std::string name
      { std::string("ComplementarityConstraint[") +
          Expr::GetTypeName() + ']' };
    return name.c_str();
  }